

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * exprTableRegister(Parse *pParse,Table *pTab,int regBase,i16 iCol)

{
  sqlite3 *db;
  Column *pCVar1;
  Expr *pExpr;
  Expr *pEVar2;
  char *zC;
  
  db = pParse->db;
  pExpr = sqlite3Expr(db,0x9d,(char *)0x0);
  pEVar2 = (Expr *)0x0;
  if (pExpr != (Expr *)0x0) {
    if ((-1 < iCol) && (pTab->iPKey != iCol)) {
      pCVar1 = pTab->aCol;
      pExpr->iTable = iCol + regBase + 1;
      pExpr->affinity = pCVar1[(ushort)iCol].affinity;
      zC = pCVar1[(ushort)iCol].zColl;
      if (zC == (char *)0x0) {
        zC = db->pDfltColl->zName;
      }
      pEVar2 = sqlite3ExprAddCollateString(pParse,pExpr,zC);
      return pEVar2;
    }
    pExpr->iTable = regBase;
    pExpr->affinity = 'D';
    pEVar2 = pExpr;
  }
  return pEVar2;
}

Assistant:

static Expr *exprTableRegister(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* The table whose content is at r[regBase]... */
  int regBase,       /* Contents of table pTab */
  i16 iCol           /* Which column of pTab is desired */
){
  Expr *pExpr;
  Column *pCol;
  const char *zColl;
  sqlite3 *db = pParse->db;

  pExpr = sqlite3Expr(db, TK_REGISTER, 0);
  if( pExpr ){
    if( iCol>=0 && iCol!=pTab->iPKey ){
      pCol = &pTab->aCol[iCol];
      pExpr->iTable = regBase + iCol + 1;
      pExpr->affinity = pCol->affinity;
      zColl = pCol->zColl;
      if( zColl==0 ) zColl = db->pDfltColl->zName;
      pExpr = sqlite3ExprAddCollateString(pParse, pExpr, zColl);
    }else{
      pExpr->iTable = regBase;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }
  }
  return pExpr;
}